

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<-15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<-28>,_boost::random::detail::no_tempering>,_738093167U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<_15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<_28>,_boost::random::detail::no_tempering>,_738093167U>
           *this)

{
  type __n;
  type last;
  int local_90;
  result_type local_8c;
  int iterations;
  result_type x;
  uint *p;
  uint local_78 [2];
  uint state [25];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<_15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<_28>,_boost::random::detail::no_tempering>,_738093167U>
  *this_local;
  
  unique0x100000aa = this;
  __n = boost::size<unsigned_int[25]>((uint (*) [25])local_78);
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_78,__n,(int *)((long)&p + 4));
  _iterations = local_78;
  last = boost::range_adl_barrier::end<unsigned_int[25]>((uint (*) [25])local_78);
  boost::random::
  well_engine<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,boost::random::detail::M1,boost::random::detail::M3<-15>,boost::random::detail::M3<10>,boost::random::detail::M3<-11>,boost::random::detail::M3<16>,boost::random::detail::M2<20>,boost::random::detail::M1,boost::random::detail::M3<-28>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,boost::random::detail::M1,boost::random::detail::M3<_15>,boost::random::detail::M3<10>,boost::random::detail::M3<_11>,boost::random::detail::M3<16>,boost::random::detail::M2<20>,boost::random::detail::M1,boost::random::detail::M3<_28>,boost::random::detail::no_tempering>
              *)this,(uint **)&iterations,last);
  local_90 = 1000000000;
  while (0 < local_90) {
    local_8c = boost::random::
               well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<-15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<-28>,_boost::random::detail::no_tempering>
               ::operator()(&this->rng);
    local_90 = local_90 + -1;
  }
  return local_8c;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }